

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::RealMath2Function<&hypot>::RealMath2Function
          (RealMath2Function<&hypot> *this,Compilation *comp,string *name)

{
  initializer_list<const_slang::ast::Type_*> __l;
  allocator_type local_51;
  _Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_50;
  Type *local_38;
  Type *local_30;
  
  local_38 = comp->realType;
  __l._M_len = 2;
  __l._M_array = &local_38;
  local_30 = local_38;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_50,__l,&local_51);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,name,Function,2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_50,comp->realType,false,false);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_50);
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_00476480;
  return;
}

Assistant:

RealMath2Function(Compilation& comp, const std::string& name) :
        SimpleSystemSubroutine(name, SubroutineKind::Function, 2,
                               {&comp.getRealType(), &comp.getRealType()}, comp.getRealType(),
                               false) {}